

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-expression.c
# Opt level: O0

expression_t * expression_new(void)

{
  expression_operation_t *peVar1;
  expression_t *expression;
  
  expression = (expression_t *)mem_zalloc(0x20);
  if (expression == (expression_t *)0x0) {
    expression = (expression_t *)0x0;
  }
  else {
    expression->base_value = (expression_base_value_f)0x0;
    expression->operation_count = 0;
    expression->operations_size = 5;
    peVar1 = (expression_operation_t *)mem_zalloc(expression->operations_size << 2);
    expression->operations = peVar1;
    if (expression->operations == (expression_operation_t *)0x0) {
      mem_free(expression);
      expression = (expression_t *)0x0;
    }
  }
  return expression;
}

Assistant:

expression_t *expression_new(void)
{
	expression_t *expression = mem_zalloc(sizeof(expression_t));

	if (expression == NULL)
		return NULL;

	expression->base_value = NULL;
	expression->operation_count = 0;
	expression->operations_size = EXPRESSION_ALLOC_SIZE;
	expression->operations = mem_zalloc(expression->operations_size *
										sizeof(expression_operation_t));

	if (expression->operations == NULL) {
		mem_free(expression);
		return NULL;
	}

	return expression;
}